

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int type)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  void *local_60;
  int *local_58;
  size_t local_50;
  Allocator *local_48;
  int local_40;
  int local_3c;
  int iStack_38;
  int local_34;
  size_t local_30;
  
  uVar2 = h * w;
  (**this->_vptr_ModelBin)(&local_60,this,(ulong)uVar2,type);
  if (local_60 == (void *)0x0) {
LAB_00132c92:
    __return_storage_ptr__->data = local_60;
    __return_storage_ptr__->refcount = local_58;
    __return_storage_ptr__->elemsize = local_50;
    __return_storage_ptr__->allocator = local_48;
    __return_storage_ptr__->dims = local_40;
    if (local_58 != (int *)0x0) {
      LOCK();
      *local_58 = *local_58 + 1;
      UNLOCK();
    }
    __return_storage_ptr__->w = local_3c;
    __return_storage_ptr__->h = iStack_38;
    __return_storage_ptr__->c = local_34;
  }
  else {
    if (local_30 * (long)local_34 == 0) goto LAB_00132c92;
    if (iStack_38 * local_3c * local_34 != uVar2) {
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->cstep = 0;
      goto LAB_00132d8f;
    }
    if ((local_40 == 3) && (local_30 != (long)iStack_38 * (long)local_3c)) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = local_50;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 2;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = h;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)(int)uVar2;
      if (uVar2 == 0) {
        pvVar4 = (void *)0x0;
      }
      else {
        uVar3 = local_50 * (long)(int)uVar2 + 3 & 0xfffffffffffffffc;
        pvVar1 = malloc(uVar3 + 0x1c);
        pvVar4 = (void *)((long)pvVar1 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar4 + -8) = pvVar1;
        __return_storage_ptr__->data = pvVar4;
        __return_storage_ptr__->refcount = (int *)((long)pvVar4 + uVar3);
        *(undefined4 *)((long)pvVar4 + uVar3) = 1;
      }
      if (0 < local_34) {
        lVar5 = 0;
        do {
          memcpy((void *)((long)((int)lVar5 * iStack_38 * local_3c) * local_50 + (long)pvVar4),
                 (void *)(local_30 * lVar5 * local_50 + (long)local_60),
                 (long)(iStack_38 * local_3c) * local_50);
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_34);
      }
      goto LAB_00132d8f;
    }
    __return_storage_ptr__->data = local_60;
    __return_storage_ptr__->refcount = local_58;
    __return_storage_ptr__->elemsize = local_50;
    __return_storage_ptr__->allocator = local_48;
    __return_storage_ptr__->dims = local_40;
    if (local_58 != (int *)0x0) {
      LOCK();
      *local_58 = *local_58 + 1;
      UNLOCK();
    }
    __return_storage_ptr__->dims = 2;
    __return_storage_ptr__->w = w;
    __return_storage_ptr__->h = h;
    __return_storage_ptr__->c = 1;
    local_30 = (size_t)(int)uVar2;
  }
  __return_storage_ptr__->cstep = local_30;
LAB_00132d8f:
  if (local_58 != (int *)0x0) {
    LOCK();
    *local_58 = *local_58 + -1;
    UNLOCK();
    if (*local_58 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_60 != (void *)0x0) {
          free(*(void **)((long)local_60 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_48 + 8))();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}